

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O0

void on_amqp_send_complete_callback
               (AMQP_MESSENGER_SEND_RESULT result,AMQP_MESSENGER_REASON reason,void *context)

{
  undefined8 uVar1;
  undefined8 uVar2;
  TWIN_REPORT_STATE_RESULT TVar3;
  TWIN_REPORT_STATE_REASON TVar4;
  int iVar5;
  LOGGER_LOG p_Var6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  LOGGER_LOG l_1;
  TWIN_REPORT_STATE_REASON callback_reason;
  TWIN_REPORT_STATE_RESULT callback_result;
  TWIN_OPERATION_CONTEXT *twin_op_ctx;
  LOGGER_LOG l;
  void *context_local;
  AMQP_MESSENGER_REASON reason_local;
  AMQP_MESSENGER_SEND_RESULT result_local;
  
  if (context == (void *)0x0) {
    p_Var6 = xlogging_get_log_function();
    if (p_Var6 != (LOGGER_LOG)0x0) {
      (*p_Var6)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"on_amqp_send_complete_callback",0x378,1,"Invalid argument (context is NULL)");
    }
  }
  else if (result != AMQP_MESSENGER_SEND_RESULT_SUCCESS) {
    if (*context == 1) {
      if (*(long *)((long)context + 0x18) != 0) {
        TVar3 = get_twin_messenger_result_from(result);
        TVar4 = get_twin_messenger_reason_from(reason);
        (**(code **)((long)context + 0x18))(TVar3,TVar4,0,*(undefined8 *)((long)context + 0x20));
      }
    }
    else if (*context == 3) {
      if (*(long *)((long)context + 0x18) != 0) {
        (**(code **)((long)context + 0x18))(1,0,0,*(undefined8 *)((long)context + 0x20));
      }
    }
    else if (reason != AMQP_MESSENGER_REASON_MESSENGER_DESTROYED) {
      p_Var6 = xlogging_get_log_function();
      if (p_Var6 != (LOGGER_LOG)0x0) {
        uVar1 = *(undefined8 *)(*(long *)((long)context + 8) + 0x10);
        pcVar7 = TWIN_OPERATION_TYPEStrings(*context);
        uVar2 = *(undefined8 *)((long)context + 0x10);
        pcVar8 = AMQP_MESSENGER_SEND_RESULTStrings(result);
        pcVar9 = AMQP_MESSENGER_REASONStrings(reason);
        (*p_Var6)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                  ,"on_amqp_send_complete_callback",0x39a,1,
                  "Failed sending TWIN operation request (%s, %s, %s, %s, %s)",uVar1,pcVar7,uVar2,
                  pcVar8,pcVar9);
      }
      if ((*context == 2) && (*(int *)(*(long *)((long)context + 8) + 0x50) == 3)) {
        *(undefined4 *)(*(long *)((long)context + 8) + 0x50) = 2;
        *(long *)(*(long *)((long)context + 8) + 0x58) =
             *(long *)(*(long *)((long)context + 8) + 0x58) + 1;
      }
      else if ((*context == 4) && (*(int *)(*(long *)((long)context + 8) + 0x50) == 3)) {
        *(undefined4 *)(*(long *)((long)context + 8) + 0x50) = 2;
        *(long *)(*(long *)((long)context + 8) + 0x58) =
             *(long *)(*(long *)((long)context + 8) + 0x58) + 1;
      }
    }
    iVar5 = remove_twin_operation_context_from_queue((TWIN_OPERATION_CONTEXT *)context);
    if (iVar5 == 0) {
      destroy_twin_operation_context((TWIN_OPERATION_CONTEXT *)context);
    }
    else {
      update_state(*(TWIN_MESSENGER_INSTANCE_conflict **)((long)context + 8),
                   TWIN_MESSENGER_STATE_ERROR);
    }
  }
  return;
}

Assistant:

static void on_amqp_send_complete_callback(AMQP_MESSENGER_SEND_RESULT result, AMQP_MESSENGER_REASON reason, void* context)
{
    // Applicable to TWIN requests for reported state PATCH, GET, PUT, DELETE.

    if (context == NULL)
    {
        LogError("Invalid argument (context is NULL)");
    }
    else
    {
        TWIN_OPERATION_CONTEXT* twin_op_ctx = (TWIN_OPERATION_CONTEXT*)context;

        if (result != AMQP_MESSENGER_SEND_RESULT_SUCCESS)
        {
            if (twin_op_ctx->type == TWIN_OPERATION_TYPE_PATCH)
            {
                if (twin_op_ctx->cb.reported_properties.callback != NULL)
                {
                    TWIN_REPORT_STATE_RESULT callback_result;
                    TWIN_REPORT_STATE_REASON callback_reason;

                    callback_result = get_twin_messenger_result_from(result);
                    callback_reason = get_twin_messenger_reason_from(reason);

                    twin_op_ctx->cb.reported_properties.callback(callback_result, callback_reason, 0, (void*)twin_op_ctx->cb.reported_properties.context);
                }
            }
            else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_GET_ON_DEMAND)
            {
                if (twin_op_ctx->cb.get_twin.callback != NULL)
                {
                    twin_op_ctx->cb.get_twin.callback(TWIN_UPDATE_TYPE_COMPLETE, NULL, 0, (void*)twin_op_ctx->cb.get_twin.context);
                }
            }
            else if (reason != AMQP_MESSENGER_REASON_MESSENGER_DESTROYED)
            {
                LogError("Failed sending TWIN operation request (%s, %s, %s, %s, %s)",
                    twin_op_ctx->msgr->device_id,
                    MU_ENUM_TO_STRING(TWIN_OPERATION_TYPE, twin_op_ctx->type),
                    twin_op_ctx->correlation_id,
                    MU_ENUM_TO_STRING(AMQP_MESSENGER_SEND_RESULT, result), MU_ENUM_TO_STRING(AMQP_MESSENGER_REASON, reason));

                if (twin_op_ctx->type == TWIN_OPERATION_TYPE_GET &&
                    twin_op_ctx->msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_GETTING_COMPLETE_PROPERTIES)
                {
                    twin_op_ctx->msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_GET_COMPLETE_PROPERTIES;
                    twin_op_ctx->msgr->subscription_error_count++;
                }
                else if (twin_op_ctx->type == TWIN_OPERATION_TYPE_PUT &&
                    twin_op_ctx->msgr->subscription_state == TWIN_SUBSCRIPTION_STATE_GETTING_COMPLETE_PROPERTIES)
                {
                    twin_op_ctx->msgr->subscription_state = TWIN_SUBSCRIPTION_STATE_GET_COMPLETE_PROPERTIES;
                    twin_op_ctx->msgr->subscription_error_count++;
                }
            }

            if (remove_twin_operation_context_from_queue(twin_op_ctx) != RESULT_OK)
            {
                update_state(twin_op_ctx->msgr, TWIN_MESSENGER_STATE_ERROR);
            }
            else
            {
                destroy_twin_operation_context(twin_op_ctx);
            }
        }
    }
}